

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_load_image_from_file
          (rf_image *__return_storage_ptr__,char *filename,rf_allocator allocator,
          rf_allocator temp_allocator,rf_io_callbacks io)

{
  long lVar1;
  rf_allocator temp_allocator_00;
  rf_allocator temp_allocator_01;
  rf_allocator allocator_00;
  rf_allocator allocator_01;
  _Bool _Var2;
  rf_int rVar3;
  long *in_FS_OFFSET;
  undefined4 uStack_194;
  undefined4 uStack_15c;
  undefined4 uStack_124;
  undefined4 uStack_bc;
  rf_image local_a0;
  rf_image local_88;
  undefined8 local_70;
  long local_68;
  undefined4 local_60;
  char *local_58;
  char *local_50;
  undefined8 local_48;
  void *local_40;
  uchar *image_file_buffer;
  char *pcStack_30;
  int file_size;
  char *filename_local;
  rf_allocator temp_allocator_local;
  rf_allocator allocator_local;
  
  temp_allocator_local.user_data = temp_allocator.allocator_proc;
  filename_local = (char *)temp_allocator.user_data;
  temp_allocator_local.allocator_proc = (rf_allocator_proc *)allocator.user_data;
  pcStack_30 = filename;
  memset(__return_storage_ptr__,0,0x18);
  _Var2 = rf_supports_image_file_type(pcStack_30);
  if (_Var2) {
    rVar3 = (*io.file_size_proc)(io.user_data,pcStack_30);
    image_file_buffer._4_4_ = (uint)rVar3;
    if ((int)image_file_buffer._4_4_ < 1) {
      rf_log_impl(8,0x1b27c6,(char *)0x3,pcStack_30);
      lVar1 = *in_FS_OFFSET;
      *(char **)(lVar1 + -0x460) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(lVar1 + -0x458) = "rf_load_image_from_file";
      *(undefined8 *)(lVar1 + -0x450) = 0x3d31;
      *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_15c,3);
    }
    else {
      local_58 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      local_50 = "rf_load_image_from_file";
      local_48 = 0x3d1c;
      local_70 = 0;
      local_68 = (long)(int)image_file_buffer._4_4_;
      local_60 = 0;
      local_40 = (void *)(*(code *)temp_allocator_local.user_data)(&filename_local,1);
      if (local_40 == (void *)0x0) {
        rf_log_impl(8,0x1b27dc,(char *)0x2,(ulong)image_file_buffer._4_4_);
        lVar1 = *in_FS_OFFSET;
        *(char **)(lVar1 + -0x460) =
             "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
        ;
        *(char **)(lVar1 + -0x458) = "rf_load_image_from_file";
        *(undefined8 *)(lVar1 + -0x450) = 0x3d2f;
        *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_124,2);
      }
      else {
        _Var2 = (*io.read_file_proc)
                          (io.user_data,pcStack_30,local_40,(long)(int)image_file_buffer._4_4_);
        if (_Var2) {
          _Var2 = rf_is_file_extension(pcStack_30,".hdr");
          if (_Var2) {
            allocator_00.allocator_proc = allocator.allocator_proc;
            allocator_00.user_data = temp_allocator_local.allocator_proc;
            temp_allocator_00.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
            temp_allocator_00.user_data = filename_local;
            rf_load_image_from_hdr_file_data
                      (&local_88,local_40,(long)(int)image_file_buffer._4_4_,allocator_00,
                       temp_allocator_00);
            __return_storage_ptr__->data = local_88.data;
            __return_storage_ptr__->width = local_88.width;
            __return_storage_ptr__->height = local_88.height;
            __return_storage_ptr__->format = local_88.format;
            __return_storage_ptr__->valid = local_88.valid;
            *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_88._21_3_;
          }
          else {
            allocator_01.allocator_proc = allocator.allocator_proc;
            allocator_01.user_data = temp_allocator_local.allocator_proc;
            temp_allocator_01.allocator_proc = (rf_allocator_proc *)temp_allocator_local.user_data;
            temp_allocator_01.user_data = filename_local;
            rf_load_image_from_file_data
                      (&local_a0,local_40,(long)(int)image_file_buffer._4_4_,allocator_01,
                       temp_allocator_01);
            __return_storage_ptr__->data = local_a0.data;
            __return_storage_ptr__->width = local_a0.width;
            __return_storage_ptr__->height = local_a0.height;
            __return_storage_ptr__->format = local_a0.format;
            __return_storage_ptr__->valid = local_a0.valid;
            *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_a0._21_3_;
          }
        }
        else {
          rf_log_impl(8,0x1b27c6,(char *)0x3,pcStack_30);
          lVar1 = *in_FS_OFFSET;
          *(char **)(lVar1 + -0x460) =
               "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
          ;
          *(char **)(lVar1 + -0x458) = "rf_load_image_from_file";
          *(undefined8 *)(lVar1 + -0x450) = 0x3d2b;
          *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_bc,3);
        }
        (*(code *)temp_allocator_local.user_data)(&filename_local,3);
      }
    }
  }
  else {
    rf_log_impl(8,0x1b2803,(char *)0x9,pcStack_30);
    lVar1 = *in_FS_OFFSET;
    *(char **)(lVar1 + -0x460) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(lVar1 + -0x458) = "rf_load_image_from_file";
    *(undefined8 *)(lVar1 + -0x450) = 0x3d33;
    *(ulong *)(lVar1 + -0x448) = CONCAT44(uStack_194,9);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_file(const char* filename, rf_allocator allocator, rf_allocator temp_allocator, rf_io_callbacks io)
{
    rf_image image = {0};

    if (rf_supports_image_file_type(filename))
    {
        int file_size = RF_FILE_SIZE(io, filename);

        if (file_size > 0)
        {
            unsigned char* image_file_buffer = RF_ALLOC(temp_allocator, file_size);

            if (image_file_buffer)
            {
                if (RF_READ_FILE(io, filename, image_file_buffer, file_size))
                {
                    if (rf_is_file_extension(filename, ".hdr"))
                    {
                        image = rf_load_image_from_hdr_file_data(image_file_buffer, file_size, allocator, temp_allocator);
                    }
                    else
                    {
                        image = rf_load_image_from_file_data(image_file_buffer, file_size, allocator, temp_allocator);
                    }
                }
                else RF_LOG_ERROR(RF_BAD_IO, "File size for %s is 0", filename);

                RF_FREE(temp_allocator, image_file_buffer);
            }
            else RF_LOG_ERROR(RF_BAD_ALLOC, "Temporary allocation of size %d failed", file_size);
        }
        else RF_LOG_ERROR(RF_BAD_IO, "File size for %s is 0", filename);
    }
    else RF_LOG_ERROR(RF_UNSUPPORTED, "Image fileformat not supported", filename);

    return image;
}